

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O0

uint32_t __thiscall FastPForLib::PFor2008::howmanybits(PFor2008 *this,uint32_t *in,size_t len)

{
  uint32_t k;
  uint32_t accumulator;
  size_t len_local;
  uint32_t *in_local;
  PFor2008 *this_local;
  uint32_t local_4;
  
  accumulator = 0;
  for (k = 0; k < len; k = k + 1) {
    accumulator = in[k] | accumulator;
  }
  if (accumulator < 0x10000) {
    if (accumulator < 0x100) {
      local_4 = 8;
    }
    else {
      local_4 = 0x10;
    }
  }
  else {
    local_4 = 0x20;
  }
  return local_4;
}

Assistant:

uint32_t howmanybits(const uint32_t *in, const size_t len) {
    uint32_t accumulator = 0;
    for (uint32_t k = 0; k < len; ++k) {
      accumulator |= in[k];
    }
    if (accumulator >= (1U << 16))
      return 32;
    if (accumulator >= (1U << 8))
      return 16;
    return 8;
  }